

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O3

void __thiscall cmGraphVizWriter::Write(cmGraphVizWriter *this)

{
  _Elt_pointer *ppvVar1;
  _Rb_tree_header *p_Var2;
  cmGlobalGenerator *pcVar3;
  cmLocalGenerator *pcVar4;
  pointer puVar5;
  cmGeneratorTarget *t;
  cmLinkItem *pcVar6;
  undefined1 auVar7 [8];
  bool bVar8;
  string *name;
  _Base_ptr p_Var9;
  mapped_type *pmVar10;
  cmMakefile *pcVar11;
  unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> *gt;
  pointer puVar12;
  cmLinkItem *pcVar13;
  unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> *lg;
  pointer puVar14;
  cmLinkItem *rootItem;
  cmLinkItem item;
  set<const_cmGeneratorTarget_*,_cmGeneratorTarget::StrictTargetComparison,_std::allocator<const_cmGeneratorTarget_*>_>
  sortedGeneratorTargets;
  undefined1 local_e0 [8];
  _Base_ptr *local_d8;
  _Base_ptr local_c8 [2];
  undefined1 local_b8 [8];
  undefined1 local_b0 [8];
  undefined1 local_a8 [48];
  undefined1 local_78 [16];
  undefined1 local_68 [8];
  _Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_cmGeneratorTarget::StrictTargetComparison,_std::allocator<const_cmGeneratorTarget_*>_>
  local_60;
  
  pcVar3 = this->GlobalGenerator;
  (*pcVar3->_vptr_cmGlobalGenerator[3])(local_b8,pcVar3);
  (*(this->super_cmLinkItemGraphVisitor)._vptr_cmLinkItemGraphVisitor[2])(this,local_b8);
  if (local_b8 != (undefined1  [8])local_a8) {
    operator_delete((void *)local_b8,(ulong)(local_a8._0_8_ + 1));
  }
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  puVar14 = (pcVar3->LocalGenerators).
            super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_78._0_8_ =
       (pcVar3->LocalGenerators).
       super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (puVar14 != (pointer)local_78._0_8_) {
    do {
      pcVar4 = (puVar14->_M_t).
               super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>._M_t.
               super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>.
               super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl;
      puVar5 = (pcVar4->GeneratorTargets).
               super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (puVar12 = *(pointer *)
                      &(pcVar4->GeneratorTargets).
                       super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
                       ._M_impl; puVar12 != puVar5; puVar12 = puVar12 + 1) {
        name = cmGeneratorTarget::GetName_abi_cxx11_
                         ((cmGeneratorTarget *)
                          (puVar12->_M_t).
                          super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                         );
        bVar8 = cmGlobalGenerator::IsReservedTarget(name);
        if (!bVar8) {
          local_b8 = *(undefined1 (*) [8])
                      &(puVar12->_M_t).
                       super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
          ;
          std::
          _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,cmGeneratorTarget::StrictTargetComparison,std::allocator<cmGeneratorTarget_const*>>
          ::_M_insert_unique<cmGeneratorTarget_const*>
                    ((_Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,cmGeneratorTarget::StrictTargetComparison,std::allocator<cmGeneratorTarget_const*>>
                      *)&local_60,(cmGeneratorTarget **)local_b8);
        }
      }
      puVar14 = puVar14 + 1;
    } while (puVar14 != (pointer)local_78._0_8_);
    if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left !=
        &local_60._M_impl.super__Rb_tree_header) {
      p_Var9 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        t = *(cmGeneratorTarget **)(p_Var9 + 1);
        cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)(local_78 + 8));
        cmLinkItem::cmLinkItem((cmLinkItem *)local_b8,t,false,(cmListFileBacktrace *)(local_78 + 8))
        ;
        if (local_68 != (undefined1  [8])0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68);
        }
        cmLinkItemGraphVisitor::VisitItem
                  (&this->super_cmLinkItemGraphVisitor,(cmLinkItem *)local_b8);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._40_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._40_8_);
        }
        if (local_b8 != (undefined1  [8])local_a8) {
          operator_delete((void *)local_b8,(ulong)(local_a8._0_8_ + 1));
        }
        p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
      } while ((_Rb_tree_header *)p_Var9 != &local_60._M_impl.super__Rb_tree_header);
    }
  }
  if (this->GeneratePerTarget != false) {
    local_d8 = local_c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"");
    local_a8._8_8_ = local_b0;
    local_b0._0_4_ = _S_red;
    local_a8._0_8_ = (cmTarget *)0x0;
    local_a8._24_8_ = (cmGlobalGenerator *)0x0;
    p_Var9 = (this->PerTargetConnections)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var2 = &(this->PerTargetConnections)._M_t._M_impl.super__Rb_tree_header;
    local_a8._16_8_ = local_a8._8_8_;
    if ((_Rb_tree_header *)p_Var9 != p_Var2) {
      do {
        pmVar10 = std::
                  map<cmLinkItem,_std::vector<cmGraphVizWriter::Connection,_std::allocator<cmGraphVizWriter::Connection>_>,_std::less<cmLinkItem>,_std::allocator<std::pair<const_cmLinkItem,_std::vector<cmGraphVizWriter::Connection,_std::allocator<cmGraphVizWriter::Connection>_>_>_>_>
                  ::operator[]((map<cmLinkItem,_std::vector<cmGraphVizWriter::Connection,_std::allocator<cmGraphVizWriter::Connection>_>,_std::less<cmLinkItem>,_std::allocator<std::pair<const_cmLinkItem,_std::vector<cmGraphVizWriter::Connection,_std::allocator<cmGraphVizWriter::Connection>_>_>_>_>
                                *)local_b8,(key_type *)(p_Var9 + 1));
        FindAllConnections(this,&this->PerTargetConnections,(key_type *)(p_Var9 + 1),pmVar10);
        p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
      } while ((_Rb_tree_header *)p_Var9 != p_Var2);
      pcVar11 = (cmMakefile *)local_a8._8_8_;
      if ((cmMakefile *)local_a8._8_8_ != (cmMakefile *)local_b0) {
        do {
          ppvVar1 = &(pcVar11->FindPackageRootPathStack).
                     super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     ._M_impl.super__Deque_impl_data._M_start._M_last;
          bVar8 = ItemExcluded(this,(cmLinkItem *)ppvVar1);
          if (!bVar8) {
            CreateTargetFile((cmGraphVizWriter *)local_e0,(cmLinkItem *)this,(string *)ppvVar1);
            pcVar6 = (cmLinkItem *)
                     (pcVar11->CMP0054ReportedIds)._M_t._M_impl.super__Rb_tree_header._M_header.
                     _M_left;
            for (pcVar13 = (cmLinkItem *)
                           (pcVar11->CMP0054ReportedIds)._M_t._M_impl.super__Rb_tree_header.
                           _M_header._M_parent; auVar7 = local_e0, pcVar13 != pcVar6;
                pcVar13 = (cmLinkItem *)&pcVar13[2].Target) {
              WriteNode(this,(cmGeneratedFileStream *)local_e0,pcVar13 + 1);
              WriteConnection(this,(cmGeneratedFileStream *)local_e0,pcVar13,pcVar13 + 1,
                              &pcVar13[2].String);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_e0,"}\n",2);
            (*(((ofstream *)auVar7)->super_basic_ostream<char,_std::char_traits<char>_>).
              _vptr_basic_ostream[1])(auVar7);
          }
          pcVar11 = (cmMakefile *)std::_Rb_tree_increment((_Rb_tree_node_base *)pcVar11);
        } while (pcVar11 != (cmMakefile *)local_b0);
      }
    }
    std::
    _Rb_tree<cmLinkItem,_std::pair<const_cmLinkItem,_std::vector<cmGraphVizWriter::Connection,_std::allocator<cmGraphVizWriter::Connection>_>_>,_std::_Select1st<std::pair<const_cmLinkItem,_std::vector<cmGraphVizWriter::Connection,_std::allocator<cmGraphVizWriter::Connection>_>_>_>,_std::less<cmLinkItem>,_std::allocator<std::pair<const_cmLinkItem,_std::vector<cmGraphVizWriter::Connection,_std::allocator<cmGraphVizWriter::Connection>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<cmLinkItem,_std::pair<const_cmLinkItem,_std::vector<cmGraphVizWriter::Connection,_std::allocator<cmGraphVizWriter::Connection>_>_>,_std::_Select1st<std::pair<const_cmLinkItem,_std::vector<cmGraphVizWriter::Connection,_std::allocator<cmGraphVizWriter::Connection>_>_>_>,_std::less<cmLinkItem>,_std::allocator<std::pair<const_cmLinkItem,_std::vector<cmGraphVizWriter::Connection,_std::allocator<cmGraphVizWriter::Connection>_>_>_>_>
                 *)local_b8);
    if (local_d8 != local_c8) {
      operator_delete(local_d8,(ulong)((long)&local_c8[0]->_M_color + 1));
    }
  }
  if (this->GenerateDependers == true) {
    local_d8 = local_c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,".dependers","");
    local_a8._8_8_ = local_b0;
    local_b0._0_4_ = _S_red;
    local_a8._0_8_ = (cmTarget *)0x0;
    local_a8._24_8_ = (cmGlobalGenerator *)0x0;
    p_Var9 = (this->TargetDependersConnections)._M_t._M_impl.super__Rb_tree_header._M_header._M_left
    ;
    p_Var2 = &(this->TargetDependersConnections)._M_t._M_impl.super__Rb_tree_header;
    local_a8._16_8_ = local_a8._8_8_;
    if ((_Rb_tree_header *)p_Var9 != p_Var2) {
      do {
        pmVar10 = std::
                  map<cmLinkItem,_std::vector<cmGraphVizWriter::Connection,_std::allocator<cmGraphVizWriter::Connection>_>,_std::less<cmLinkItem>,_std::allocator<std::pair<const_cmLinkItem,_std::vector<cmGraphVizWriter::Connection,_std::allocator<cmGraphVizWriter::Connection>_>_>_>_>
                  ::operator[]((map<cmLinkItem,_std::vector<cmGraphVizWriter::Connection,_std::allocator<cmGraphVizWriter::Connection>_>,_std::less<cmLinkItem>,_std::allocator<std::pair<const_cmLinkItem,_std::vector<cmGraphVizWriter::Connection,_std::allocator<cmGraphVizWriter::Connection>_>_>_>_>
                                *)local_b8,(key_type *)(p_Var9 + 1));
        FindAllConnections(this,&this->TargetDependersConnections,(key_type *)(p_Var9 + 1),pmVar10);
        p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
      } while ((_Rb_tree_header *)p_Var9 != p_Var2);
      pcVar11 = (cmMakefile *)local_a8._8_8_;
      if ((cmMakefile *)local_a8._8_8_ != (cmMakefile *)local_b0) {
        do {
          ppvVar1 = &(pcVar11->FindPackageRootPathStack).
                     super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     ._M_impl.super__Deque_impl_data._M_start._M_last;
          bVar8 = ItemExcluded(this,(cmLinkItem *)ppvVar1);
          if (!bVar8) {
            CreateTargetFile((cmGraphVizWriter *)local_e0,(cmLinkItem *)this,(string *)ppvVar1);
            pcVar6 = (cmLinkItem *)
                     (pcVar11->CMP0054ReportedIds)._M_t._M_impl.super__Rb_tree_header._M_header.
                     _M_left;
            for (pcVar13 = (cmLinkItem *)
                           (pcVar11->CMP0054ReportedIds)._M_t._M_impl.super__Rb_tree_header.
                           _M_header._M_parent; auVar7 = local_e0, pcVar13 != pcVar6;
                pcVar13 = (cmLinkItem *)&pcVar13[2].Target) {
              WriteNode(this,(cmGeneratedFileStream *)local_e0,pcVar13 + 1);
              WriteConnection(this,(cmGeneratedFileStream *)local_e0,pcVar13 + 1,pcVar13,
                              &pcVar13[2].String);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_e0,"}\n",2);
            (*(((ofstream *)auVar7)->super_basic_ostream<char,_std::char_traits<char>_>).
              _vptr_basic_ostream[1])(auVar7);
          }
          pcVar11 = (cmMakefile *)std::_Rb_tree_increment((_Rb_tree_node_base *)pcVar11);
        } while (pcVar11 != (cmMakefile *)local_b0);
      }
    }
    std::
    _Rb_tree<cmLinkItem,_std::pair<const_cmLinkItem,_std::vector<cmGraphVizWriter::Connection,_std::allocator<cmGraphVizWriter::Connection>_>_>,_std::_Select1st<std::pair<const_cmLinkItem,_std::vector<cmGraphVizWriter::Connection,_std::allocator<cmGraphVizWriter::Connection>_>_>_>,_std::less<cmLinkItem>,_std::allocator<std::pair<const_cmLinkItem,_std::vector<cmGraphVizWriter::Connection,_std::allocator<cmGraphVizWriter::Connection>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<cmLinkItem,_std::pair<const_cmLinkItem,_std::vector<cmGraphVizWriter::Connection,_std::allocator<cmGraphVizWriter::Connection>_>_>,_std::_Select1st<std::pair<const_cmLinkItem,_std::vector<cmGraphVizWriter::Connection,_std::allocator<cmGraphVizWriter::Connection>_>_>_>,_std::less<cmLinkItem>,_std::allocator<std::pair<const_cmLinkItem,_std::vector<cmGraphVizWriter::Connection,_std::allocator<cmGraphVizWriter::Connection>_>_>_>_>
                 *)local_b8);
    if (local_d8 != local_c8) {
      operator_delete(local_d8,(ulong)((long)&local_c8[0]->_M_color + 1));
    }
  }
  std::
  _Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_cmGeneratorTarget::StrictTargetComparison,_std::allocator<const_cmGeneratorTarget_*>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void cmGraphVizWriter::Write()
{
  const auto* gg = this->GlobalGenerator;

  this->VisitGraph(gg->GetName());

  // We want to traverse in a determined order, such that the output is always
  // the same for a given project (this makes tests reproducible, etc.)
  std::set<cmGeneratorTarget const*, cmGeneratorTarget::StrictTargetComparison>
    sortedGeneratorTargets;

  for (const auto& lg : gg->GetLocalGenerators()) {
    for (const auto& gt : lg->GetGeneratorTargets()) {
      // Reserved targets have inconsistent names across platforms (e.g. 'all'
      // vs. 'ALL_BUILD'), which can disrupt the traversal ordering.
      // We don't need or want them anyway.
      if (!cmGlobalGenerator::IsReservedTarget(gt->GetName())) {
        sortedGeneratorTargets.insert(gt.get());
      }
    }
  }

  // write global data and collect all connection data for per target graphs
  for (const auto* const gt : sortedGeneratorTargets) {
    auto item = cmLinkItem(gt, false, gt->GetBacktrace());
    this->VisitItem(item);
  }

  if (this->GeneratePerTarget) {
    this->WritePerTargetConnections<DependeesDir>(this->PerTargetConnections);
  }

  if (this->GenerateDependers) {
    this->WritePerTargetConnections<DependersDir>(
      this->TargetDependersConnections, ".dependers");
  }
}